

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O1

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsVk
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  pointer *ppPVar1;
  SHADER_TYPE SVar2;
  iterator __position;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar3;
  long lVar4;
  char (*Args_1) [51];
  Uint32 ResIndex;
  PipelineResourceSignatureVkImpl *this;
  uint uVar5;
  ulong uVar6;
  string msg;
  Uint32 SignaturesCount;
  undefined1 local_b0 [36];
  uint local_8c;
  PipelineResourceBindingAttribs *local_88;
  ulong local_80;
  SignatureArray<Diligent::PipelineResourceSignatureVkImpl> local_78;
  
  SVar2 = Info->ShaderStages;
  local_78._M_elems[6].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[7].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[4].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[5].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[2].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[3].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[0].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_78._M_elems[1].m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  uVar5 = 0;
  Args_1 = (char (*) [51])&local_8c;
  local_8c = 0;
  local_88 = Info;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            (Info->ppResourceSignatures,Info->ResourceSignaturesCount,&local_78,(Uint32 *)Args_1);
  local_80 = (ulong)local_8c;
  if (local_80 != 0) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      if (local_78._M_elems[uVar6].m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
        this = local_78._M_elems[uVar6].m_pObject;
        if ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.NumResources != 0) {
          ResIndex = 0;
          do {
            ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                                (&this->
                                  super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                                 ResIndex);
            pPVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                               (&(local_78._M_elems[uVar6].m_pObject)->
                                 super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                                ResIndex);
            if ((ResDesc->ShaderStages & (-(uint)(SVar2 == SHADER_TYPE_UNKNOWN) | SVar2)) !=
                SHADER_TYPE_UNKNOWN) {
              ResDescToPipelineResBinding
                        ((PipelineResourceBinding *)local_b0,ResDesc,ResDesc->ShaderStages,
                         (uint)*(ulong *)pPVar3 & 0xffff,
                         uVar5 + ((*(ulong *)pPVar3 >> 0x3e & 1) != 0));
              __position._M_current =
                   (ResourceBindings->
                   super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (ResourceBindings->
                  super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                ::_M_realloc_insert<Diligent::PipelineResourceBinding>
                          (ResourceBindings,__position,(PipelineResourceBinding *)local_b0);
              }
              else {
                (__position._M_current)->Space = local_b0._16_2_;
                *(undefined2 *)&(__position._M_current)->field_0x12 = local_b0._18_2_;
                (__position._M_current)->Register = local_b0._20_4_;
                *(undefined8 *)&(__position._M_current)->ArraySize = local_b0._24_8_;
                (__position._M_current)->Name = (Char *)local_b0._0_8_;
                (__position._M_current)->ResourceType = local_b0[8];
                *(undefined3 *)&(__position._M_current)->field_0x9 = local_b0._9_3_;
                (__position._M_current)->ShaderStages = local_b0._12_4_;
                ppPVar1 = &(ResourceBindings->
                           super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppPVar1 = *ppPVar1 + 1;
              }
            }
            ResIndex = ResIndex + 1;
            this = local_78._M_elems[uVar6].m_pObject;
          } while (ResIndex <
                   (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                   .m_Desc.NumResources);
        }
        local_b0._0_8_ = (Char *)0x0;
        local_b0._8_8_ = 1;
        lVar4 = 0;
        do {
          Args_1 = *(char (**) [51])(local_b0 + lVar4);
          uVar5 = uVar5 + ((this->m_DescriptorSetSizes)._M_elems[(long)Args_1] != 0xffffffff);
          lVar4 = lVar4 + 8;
        } while (lVar4 != 0x10);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_80);
  }
  if (0x10 < uVar5) {
    FormatString<char[26],char[50]>
              ((string *)local_b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",
               (char (*) [50])Args_1);
    Args_1 = (char (*) [51])0x106;
    DebugAssertionFailed
              ((Char *)local_b0._0_8_,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x106);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  if (uVar5 < local_88->ResourceSignaturesCount) {
    FormatString<char[26],char[51]>
              ((string *)local_b0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount >= Info.ResourceSignaturesCount",Args_1);
    DebugAssertionFailed
              ((Char *)local_b0._0_8_,"GetPipelineResourceBindingsVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0x107);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  lVar4 = 0x38;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
               ((long)&local_78._M_elems[0].m_pObject + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != -8);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsVk(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto ShaderStages = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);

    SignatureArray<PipelineResourceSignatureVkImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    Uint32 DescSetLayoutCount = 0;
    for (Uint32 sign = 0; sign < SignaturesCount; ++sign)
    {
        const auto& pSignature = Signatures[sign];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            if ((ResDesc.ShaderStages & ShaderStages) == 0)
                continue;

            ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ResDesc.ShaderStages, ResAttr.BindingIndex, DescSetLayoutCount + ResAttr.DescrSet));
        }

        // Same as PipelineLayoutVk::Create()
        for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
        {
            if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                ++DescSetLayoutCount;
        }
    }
    VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);
    VERIFY_EXPR(DescSetLayoutCount >= Info.ResourceSignaturesCount);
}